

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

void __thiscall spv::Instruction::addStringOperand(Instruction *this,char *str)

{
  char cVar1;
  undefined8 in_RAX;
  char *pcVar2;
  int iVar3;
  int iVar4;
  uint word;
  undefined8 uStack_28;
  
  pcVar2 = (char *)((long)&uStack_28 + 4);
  iVar4 = 0;
  uStack_28 = in_RAX;
  do {
    while( true ) {
      iVar3 = iVar4;
      cVar1 = *str;
      str = str + 1;
      *pcVar2 = cVar1;
      iVar4 = iVar3 + 1;
      if (iVar4 == 4) break;
      pcVar2 = pcVar2 + 1;
      if (cVar1 == '\0') {
        if (iVar3 < 0) {
          return;
        }
        for (; iVar4 < 4; iVar4 = iVar4 + 1) {
          *pcVar2 = '\0';
          pcVar2 = pcVar2 + 1;
        }
        addImmediateOperand(this,uStack_28._4_4_);
        return;
      }
    }
    addImmediateOperand(this,uStack_28._4_4_);
    pcVar2 = (char *)((long)&uStack_28 + 4);
    iVar4 = 0;
  } while (cVar1 != '\0');
  return;
}

Assistant:

void addStringOperand(const char* str)
    {
        unsigned int word;
        char* wordString = (char*)&word;
        char* wordPtr = wordString;
        int charCount = 0;
        char c;
        do {
            c = *(str++);
            *(wordPtr++) = c;
            ++charCount;
            if (charCount == 4) {
                addImmediateOperand(word);
                wordPtr = wordString;
                charCount = 0;
            }
        } while (c != 0);

        // deal with partial last word
        if (charCount > 0) {
            // pad with 0s
            for (; charCount < 4; ++charCount)
                *(wordPtr++) = 0;
            addImmediateOperand(word);
        }
    }